

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<TPZFlopCounter>::AutoFill
          (TPZMatrix<TPZFlopCounter> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  TPZFlopCounter val;
  double local_78;
  double local_60;
  int local_54;
  REAL local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_54 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  for (lVar2 = 0; lVar2 < (this->super_TPZBaseMatrix).fRow; lVar2 = lVar2 + 1) {
    if (local_54 == 0) {
      local_78 = 0.0;
      lVar4 = 0;
    }
    else {
      local_78 = 0.0;
      for (lVar3 = 0; lVar4 = lVar2, lVar2 != lVar3; lVar3 = lVar3 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar2);
        local_60 = extraout_XMM0_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar3,&local_60);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar3);
        local_78 = local_78 + ABS(extraout_XMM0_Qa_00);
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      }
    }
    for (; lVar3 = (this->super_TPZBaseMatrix).fCol, lVar4 < lVar3; lVar4 = lVar4 + 1) {
      local_50 = (REAL)GetRandomVal(this);
      if (lVar2 != lVar4) {
        local_78 = local_78 + ABS(local_50);
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      }
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,lVar2,lVar4,&local_50);
      if (iVar1 == 0) {
        Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
      }
    }
    if ((this->super_TPZBaseMatrix).fRow == lVar3) {
      local_48 = ABS(local_78);
      uStack_40 = 0;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar2);
      if (ABS(extraout_XMM0_Qa_01) < local_48) {
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        local_60 = local_78 + 1.0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar2,&local_60);
      }
      if ((local_48 < 1e-12) &&
         ((*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar2),
         ABS(extraout_XMM0_Qa_02) < 1e-12)) {
        local_60 = 1.0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar2,&local_60);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}